

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLDocument::Identify(XMLDocument *this,char *p,XMLNode **node)

{
  int iVar1;
  bool bVar2;
  char *p_00;
  XMLElement *pXVar3;
  
  iVar1 = this->_parseCurLineNum;
  p_00 = XMLUtil::SkipWhiteSpace(p,&this->_parseCurLineNum);
  if (*p_00 == '\0') {
    pXVar3 = (XMLElement *)0x0;
    goto LAB_00111bbf;
  }
  bVar2 = XMLUtil::StringEqual(p_00,"<?",2);
  if (bVar2) {
    pXVar3 = (XMLElement *)
             CreateUnlinkedNode<tinyxml2::XMLDeclaration,104>(this,&this->_commentPool);
  }
  else {
    bVar2 = XMLUtil::StringEqual(p_00,"<!--",4);
    if (bVar2) {
      pXVar3 = (XMLElement *)CreateUnlinkedNode<tinyxml2::XMLComment,104>(this,&this->_commentPool);
      (pXVar3->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
      p_00 = p_00 + 4;
      goto LAB_00111bbf;
    }
    bVar2 = XMLUtil::StringEqual(p_00,"<![CDATA[",9);
    if (bVar2) {
      pXVar3 = (XMLElement *)CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
      (pXVar3->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
      *(bool *)&pXVar3->_closingType = true;
      p_00 = p_00 + 9;
      goto LAB_00111bbf;
    }
    bVar2 = XMLUtil::StringEqual(p_00,"<!",2);
    if (!bVar2) {
      bVar2 = XMLUtil::StringEqual(p_00,"<",1);
      if (bVar2) {
        pXVar3 = CreateUnlinkedNode<tinyxml2::XMLElement,120>(this,&this->_elementPool);
        (pXVar3->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
        p_00 = p_00 + 1;
      }
      else {
        pXVar3 = (XMLElement *)CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
        (pXVar3->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
        this->_parseCurLineNum = iVar1;
        p_00 = p;
      }
      goto LAB_00111bbf;
    }
    pXVar3 = (XMLElement *)CreateUnlinkedNode<tinyxml2::XMLUnknown,104>(this,&this->_commentPool);
  }
  (pXVar3->super_XMLNode)._parseLineNum = this->_parseCurLineNum;
  p_00 = p_00 + 2;
LAB_00111bbf:
  *node = &pXVar3->super_XMLNode;
  return p_00;
}

Assistant:

char* XMLDocument::Identify( char* p, XMLNode** node )
{
    TIXMLASSERT( node );
    TIXMLASSERT( p );
    char* const start = p;
    int const startLine = _parseCurLineNum;
    p = XMLUtil::SkipWhiteSpace( p, &_parseCurLineNum );
    if( !*p ) {
        *node = 0;
        TIXMLASSERT( p );
        return p;
    }

    // These strings define the matching patterns:
    static const char* xmlHeader		= { "<?" };
    static const char* commentHeader	= { "<!--" };
    static const char* cdataHeader		= { "<![CDATA[" };
    static const char* dtdHeader		= { "<!" };
    static const char* elementHeader	= { "<" };	// and a header for everything else; check last.

    static const int xmlHeaderLen		= 2;
    static const int commentHeaderLen	= 4;
    static const int cdataHeaderLen		= 9;
    static const int dtdHeaderLen		= 2;
    static const int elementHeaderLen	= 1;

    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLUnknown ) );		// use same memory pool
    TIXMLASSERT( sizeof( XMLComment ) == sizeof( XMLDeclaration ) );	// use same memory pool
    XMLNode* returnNode = 0;
    if ( XMLUtil::StringEqual( p, xmlHeader, xmlHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLDeclaration>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += xmlHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, commentHeader, commentHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLComment>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += commentHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, cdataHeader, cdataHeaderLen ) ) {
        XMLText* text = CreateUnlinkedNode<XMLText>( _textPool );
        returnNode = text;
        returnNode->_parseLineNum = _parseCurLineNum;
        p += cdataHeaderLen;
        text->SetCData( true );
    }
    else if ( XMLUtil::StringEqual( p, dtdHeader, dtdHeaderLen ) ) {
        returnNode = CreateUnlinkedNode<XMLUnknown>( _commentPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += dtdHeaderLen;
    }
    else if ( XMLUtil::StringEqual( p, elementHeader, elementHeaderLen ) ) {
        returnNode =  CreateUnlinkedNode<XMLElement>( _elementPool );
        returnNode->_parseLineNum = _parseCurLineNum;
        p += elementHeaderLen;
    }
    else {
        returnNode = CreateUnlinkedNode<XMLText>( _textPool );
        returnNode->_parseLineNum = _parseCurLineNum; // Report line of first non-whitespace character
        p = start;	// Back it up, all the text counts.
        _parseCurLineNum = startLine;
    }

    TIXMLASSERT( returnNode );
    TIXMLASSERT( p );
    *node = returnNode;
    return p;
}